

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  string *in_RCX;
  allocator<char> local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,"Could not convert: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
  ::std::operator+(&local_78,&local_38," = ");
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,",",&local_b9);
  detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_98,(detail *)results,&local_b8,in_RCX);
  ::std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
  ConversionError(this,(string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

ConversionError(std::string name, std::vector<std::string> results)
        : ConversionError("Could not convert: " + name + " = " + detail::join(results)) {}